

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O0

BIGNUM * BN_mpi2bn(uchar *s,int len,BIGNUM *ret)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  BIGNUM *pBVar4;
  undefined4 in_register_00000034;
  int out_is_alloced;
  size_t in_len;
  BIGNUM *out_local;
  size_t len_local;
  uint8_t *in_local;
  
  if (CONCAT44(in_register_00000034,len) < 4) {
    ERR_put_error(3,0,0x75,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                  ,0x161);
    in_local = (uint8_t *)0x0;
  }
  else {
    uVar3 = (ulong)*s << 0x18 | (ulong)s[1] << 0x10 | (ulong)s[2] << 8 | (ulong)s[3];
    if (uVar3 == CONCAT44(in_register_00000034,len) - 4) {
      bVar1 = false;
      in_len = (size_t)ret;
      if (ret == (BIGNUM *)0x0) {
        in_len = (size_t)BN_new();
        if ((BIGNUM *)in_len == (BIGNUM *)0x0) {
          return (BIGNUM *)0x0;
        }
        bVar1 = true;
      }
      if (uVar3 == 0) {
        BN_zero((BIGNUM *)in_len);
        in_local = (uint8_t *)in_len;
      }
      else {
        pBVar4 = BN_bin2bn(s + 4,(int)uVar3,(BIGNUM *)in_len);
        if (pBVar4 == (BIGNUM *)0x0) {
          if (bVar1) {
            BN_free((BIGNUM *)in_len);
          }
          in_local = (uint8_t *)0x0;
        }
        else {
          *(uint *)(in_len + 0x10) = (uint)((s[4] & 0x80) != 0);
          if (*(int *)(in_len + 0x10) != 0) {
            iVar2 = BN_num_bits((BIGNUM *)in_len);
            BN_clear_bit((BIGNUM *)in_len,iVar2 + -1);
          }
          in_local = (uint8_t *)in_len;
        }
      }
    }
    else {
      ERR_put_error(3,0,0x75,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                    ,0x169);
      in_local = (uint8_t *)0x0;
    }
  }
  return (BIGNUM *)in_local;
}

Assistant:

BIGNUM *BN_mpi2bn(const uint8_t *in, size_t len, BIGNUM *out) {
  if (len < 4) {
    OPENSSL_PUT_ERROR(BN, BN_R_BAD_ENCODING);
    return NULL;
  }
  const size_t in_len = ((size_t)in[0] << 24) | //
                        ((size_t)in[1] << 16) | //
                        ((size_t)in[2] << 8) | //
                        ((size_t)in[3]);
  if (in_len != len - 4) {
    OPENSSL_PUT_ERROR(BN, BN_R_BAD_ENCODING);
    return NULL;
  }

  int out_is_alloced = 0;
  if (out == NULL) {
    out = BN_new();
    if (out == NULL) {
      return NULL;
    }
    out_is_alloced = 1;
  }

  if (in_len == 0) {
    BN_zero(out);
    return out;
  }

  in += 4;
  if (BN_bin2bn(in, in_len, out) == NULL) {
    if (out_is_alloced) {
      BN_free(out);
    }
    return NULL;
  }
  out->neg = ((*in) & 0x80) != 0;
  if (out->neg) {
    BN_clear_bit(out, BN_num_bits(out) - 1);
  }
  return out;
}